

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-contents.h
# Opt level: O0

ConeType __thiscall wasm::PossibleContents::getCone(PossibleContents *this)

{
  add_pointer_t<const_wasm::PossibleContents::None> ptVar1;
  add_pointer_t<const_wasm::PossibleContents::Many> ptVar2;
  ConeType CVar3;
  Type local_88 [3];
  Type local_70;
  add_pointer_t<const_wasm::PossibleContents::ConeType> local_68;
  ConeType *coneType;
  uintptr_t local_50;
  add_pointer_t<const_wasm::PossibleContents::GlobalInfo> local_48;
  GlobalInfo *global;
  uintptr_t local_30;
  add_pointer_t<const_wasm::Literal> local_28;
  Literal *literal;
  PossibleContents *this_local;
  Index local_10;
  
  literal = (Literal *)this;
  local_28 = std::
             get_if<wasm::Literal,wasm::PossibleContents::None,wasm::Literal,wasm::PossibleContents::GlobalInfo,wasm::PossibleContents::ConeType,wasm::PossibleContents::Many>
                       (&this->value);
  if (local_28 == (add_pointer_t<const_wasm::Literal>)0x0) {
    local_48 = std::
               get_if<wasm::PossibleContents::GlobalInfo,wasm::PossibleContents::None,wasm::Literal,wasm::PossibleContents::GlobalInfo,wasm::PossibleContents::ConeType,wasm::PossibleContents::Many>
                         (&this->value);
    if (local_48 == (add_pointer_t<const_wasm::PossibleContents::GlobalInfo>)0x0) {
      local_68 = std::
                 get_if<wasm::PossibleContents::ConeType,wasm::PossibleContents::None,wasm::Literal,wasm::PossibleContents::GlobalInfo,wasm::PossibleContents::ConeType,wasm::PossibleContents::Many>
                           (&this->value);
      if (local_68 == (add_pointer_t<const_wasm::PossibleContents::ConeType>)0x0) {
        ptVar1 = std::
                 get_if<wasm::PossibleContents::None,wasm::PossibleContents::None,wasm::Literal,wasm::PossibleContents::GlobalInfo,wasm::PossibleContents::ConeType,wasm::PossibleContents::Many>
                           (&this->value);
        if (ptVar1 == (add_pointer_t<const_wasm::PossibleContents::None>)0x0) {
          ptVar2 = std::
                   get_if<wasm::PossibleContents::Many,wasm::PossibleContents::None,wasm::Literal,wasm::PossibleContents::GlobalInfo,wasm::PossibleContents::ConeType,wasm::PossibleContents::Many>
                             (&this->value);
          if (ptVar2 == (add_pointer_t<const_wasm::PossibleContents::Many>)0x0) {
            ::wasm::handle_unreachable
                      ("bad value",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/possible-contents.h"
                       ,0x106);
          }
          Type::Type(local_88,none);
          CVar3 = ExactType(local_88[0]);
          this_local = (PossibleContents *)CVar3.type.id;
          local_10 = CVar3.depth;
        }
        else {
          Type::Type(&local_70,unreachable);
          CVar3 = ExactType(local_70);
          this_local = (PossibleContents *)CVar3.type.id;
          local_10 = CVar3.depth;
        }
      }
      else {
        this_local = (PossibleContents *)(local_68->type).id;
        local_10 = (Index)*(undefined8 *)&local_68->depth;
      }
    }
    else {
      local_50 = (local_48->type).id;
      CVar3 = FullConeType((Type)local_50);
      this_local = (PossibleContents *)CVar3.type.id;
      local_10 = CVar3.depth;
    }
  }
  else {
    local_30 = (local_28->type).id;
    CVar3 = ExactType((Type)local_30);
    this_local = (PossibleContents *)CVar3.type.id;
    local_10 = CVar3.depth;
  }
  CVar3.depth = local_10;
  CVar3.type.id = (uintptr_t)this_local;
  CVar3._12_4_ = 0;
  return CVar3;
}

Assistant:

ConeType getCone() const {
    if (auto* literal = std::get_if<Literal>(&value)) {
      return ExactType(literal->type);
    } else if (auto* global = std::get_if<GlobalInfo>(&value)) {
      return FullConeType(global->type);
    } else if (auto* coneType = std::get_if<ConeType>(&value)) {
      return *coneType;
    } else if (std::get_if<None>(&value)) {
      return ExactType(Type::unreachable);
    } else if (std::get_if<Many>(&value)) {
      return ExactType(Type::none);
    } else {
      WASM_UNREACHABLE("bad value");
    }
  }